

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase133::run(TestCase133 *this)

{
  PointerType PVar1;
  Reader value;
  Orphan<capnp::Text> orphan;
  DebugExpression<bool> _kjCondition_4;
  undefined1 auStack_19f [15];
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_187;
  word *local_170;
  bool local_160;
  bool local_158;
  Builder root;
  Builder local_128;
  char *local_110;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&orphan,&builder.super_MessageBuilder);
  __kjCondition_1 = orphan.builder.tag.content;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition_1,(StructSize)0x140006);
  __kjCondition_1 = (uint64_t)root._builder.segment;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition_1,value);
  __kjCondition_1 = (uint64_t)root._builder.segment;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&_kjCondition_1);
  orphan.builder.tag.content._0_1_ = PVar1 != NULL_;
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x8a,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasTextField()",
               (DebugExpression<bool> *)&orphan);
  }
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition_1,(PointerBuilder *)&_kjCondition_4);
  orphan.builder.capTable = (CapTableBuilder *)root._builder.pointers;
  orphan.builder.location = local_170;
  orphan.builder.tag.content = __kjCondition_1;
  orphan.builder.segment = (SegmentBuilder *)root._builder.capTable;
  _kjCondition_1.value = local_170 != (word *)0x0;
  if ((local_170 == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x8d,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",&_kjCondition_1);
  }
  local_128._0_8_ = "foo";
  __kjCondition_4 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[4]> *)&local_128,(Reader *)&_kjCondition_4);
  if ((local_160 == false) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_4 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.getReader())\", _kjCondition, \"foo\", orphan.getReader()"
               ,(char (*) [49])"failed: expected (\"foo\") == (orphan.getReader())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition_1,
               (char (*) [4])"foo",(Reader *)&_kjCondition_4);
  }
  local_128._0_8_ = "foo";
  OrphanBuilder::asText((Builder *)&_kjCondition_4,&orphan.builder);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[4]> *)&local_128,(Builder *)&_kjCondition_4);
  if ((local_158 == false) && (kj::_::Debug::minSeverity < 3)) {
    OrphanBuilder::asText((Builder *)&_kjCondition_4,&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (orphan.get())\", _kjCondition, \"foo\", orphan.get()"
               ,(char (*) [43])"failed: expected (\"foo\") == (orphan.get())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition_1,
               (char (*) [4])"foo",(Builder *)&_kjCondition_4);
  }
  __kjCondition_1 = (uint64_t)root._builder.segment;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&_kjCondition_1);
  _kjCondition_4.value = PVar1 == NULL_;
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x91,ERROR,"\"failed: expected \" \"!(root.hasTextField())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasTextField())",&_kjCondition_4);
  }
  __kjCondition_1 = (uint64_t)root._builder.segment;
  PointerBuilder::adopt((PointerBuilder *)&_kjCondition_1,(OrphanBuilder *)&orphan);
  if ((orphan.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_1 = (uint64_t)&orphan;
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::Text>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x94,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",
               (DebugComparison<capnp::Orphan<capnp::Text>_&,_std::nullptr_t> *)&_kjCondition_1);
  }
  __kjCondition_1 = (uint64_t)root._builder.segment;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&_kjCondition_1);
  _kjCondition_4.value = PVar1 != NULL_;
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x95,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasTextField()",&_kjCondition_4);
  }
  local_110 = "foo";
  PointerBuilder::getBlob<capnp::Text>(&local_128,(PointerBuilder *)&_kjCondition_4,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition_1,
             (DebugExpression<char_const(&)[4]> *)&local_110,&local_128);
  if ((local_158 == false) && (kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>(&local_128,(PointerBuilder *)&_kjCondition_4,(void *)0x0,0)
    ;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", _kjCondition, \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition_1,
               (char (*) [4])"foo",&local_128);
  }
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, Text) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setTextField("foo");
  EXPECT_TRUE(root.hasTextField());

  Orphan<Text> orphan = root.disownTextField();
  EXPECT_FALSE(orphan == nullptr);

  EXPECT_EQ("foo", orphan.getReader());
  EXPECT_EQ("foo", orphan.get());
  EXPECT_FALSE(root.hasTextField());

  root.adoptTextField(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasTextField());
  EXPECT_EQ("foo", root.getTextField());
}